

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O3

void okim6258_write(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  code *UNRECOVERED_JUMPTABLE;
  
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if ((data & 1) != 0) {
      *(byte *)((long)chip + 8) = *(byte *)((long)chip + 8) & 0xf9;
      return;
    }
    bVar1 = *(byte *)((long)chip + 8);
    if ((data & 2) == 0) {
      bVar1 = bVar1 & 0xfd;
    }
    else {
      if ((bVar1 & 2) == 0) {
        bVar1 = bVar1 | 2;
        *(undefined2 *)((long)chip + 0x1c) = 0xfffe;
        *(UINT8 *)((long)chip + 0x20) = data;
        *(undefined2 *)((long)chip + 0x29) = 1;
      }
      *(undefined2 *)((long)chip + 0x1e) = 0;
      *(undefined1 *)((long)chip + 0x17) = 0;
    }
    if ((data & 4) == 0) {
      bVar1 = bVar1 & 0xfb;
    }
    else {
      bVar1 = bVar1 | 4;
    }
    *(byte *)((long)chip + 8) = bVar1;
    break;
  case 1:
    if (*(byte *)((long)chip + 0x2a) < 2) {
      uVar4 = (ulong)(*(byte *)((long)chip + 0x29) & 0xf);
    }
    else {
      *(undefined1 *)((long)chip + 0x29) = 0;
      uVar4 = 0;
    }
    *(UINT8 *)((long)chip + 0x28) = data;
    *(UINT8 *)((long)chip + uVar4 + 0x20) = data;
    bVar1 = *(byte *)((long)chip + 0x29) + 1;
    bVar2 = *(byte *)((long)chip + 0x29) & 7 | bVar1 & 0xf0;
    if (bVar1 >> 4 != (bVar1 & 7)) {
      bVar2 = bVar1 & 0xf7;
    }
    *(byte *)((long)chip + 0x29) = bVar2;
    *(undefined1 *)((long)chip + 0x2a) = 0;
    return;
  case 2:
    *(UINT8 *)((long)chip + 0x2b) = data;
    return;
  case 8:
  case 9:
  case 10:
    *(UINT8 *)((long)chip + (ulong)(offset & 3) + 0x2e) = data;
    return;
  case 0xb:
    *(UINT8 *)((long)chip + 0x31) = data;
    *(int *)((long)chip + 0xc) = *(int *)((long)chip + 0x2e);
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x40);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar5 = *(undefined8 *)((long)chip + 0x48);
      uVar6 = *(uint *)((long)chip + 0x10);
      uVar3 = (uVar6 >> 1) + *(int *)((long)chip + 0x2e);
LAB_0016614f:
      (*UNRECOVERED_JUMPTABLE)(uVar5,(ulong)uVar3 / (ulong)uVar6,(ulong)uVar3 % (ulong)uVar6);
      return;
    }
    break;
  case 0xc:
    uVar6 = dividers[(ulong)data & 3];
    *(uint *)((long)chip + 0x10) = uVar6;
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x40);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar5 = *(undefined8 *)((long)chip + 0x48);
      uVar3 = (uVar6 >> 1) + *(int *)((long)chip + 0xc);
      goto LAB_0016614f;
    }
  }
  return;
}

Assistant:

static void okim6258_write(void *chip, UINT8 offset, UINT8 data)
{
	switch(offset)
	{
	case 0x00:
		okim6258_ctrl_w(chip, data);
		break;
	case 0x01:
		okim6258_data_w(chip, data);
		break;
	case 0x02:
		okim6258_pan_w(chip, data);
		break;
	case 0x08:
	case 0x09:
	case 0x0A:
		okim6258_set_clock_byte(chip, offset & 0x03, data);
		break;
	case 0x0B:
		okim6258_set_clock_byte(chip, offset & 0x03, data);
		okim6258_set_clock(chip, 0);	// refresh clock
		break;
	case 0x0C:
		okim6258_set_divider(chip, data);
		break;
	}
	
	return;
}